

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# qwidget.h
# Opt level: O2

QWidget * __thiscall QMdiSubWindow::maximizedButtonsWidget(QMdiSubWindow *this)

{
  QMdiSubWindowPrivate *this_00;
  Data *pDVar1;
  bool bVar2;
  QObject *pQVar3;
  
  if ((((this->super_QWidget).data)->widget_attributes & 0x8000) != 0) {
    this_00 = *(QMdiSubWindowPrivate **)&(this->super_QWidget).field_0x8;
    bVar2 = QPointer::operator_cast_to_bool((QPointer *)&this_00->controlContainer);
    if ((((bVar2) && (bVar2 = QWidget::isMaximized(&this->super_QWidget), bVar2)) &&
        (bVar2 = QMdiSubWindowPrivate::drawTitleBarWhenMaximized(this_00), !bVar2)) &&
       (bVar2 = isChildOfTabbedQMdiArea(this), !bVar2)) {
      pDVar1 = (this_00->controlContainer).wp.d;
      if ((pDVar1 == (Data *)0x0) || (*(int *)(pDVar1 + 4) == 0)) {
        pQVar3 = (QObject *)0x0;
      }
      else {
        pQVar3 = (this_00->controlContainer).wp.value;
      }
      if ((*(long *)(pQVar3 + 0x40) != 0) && (*(int *)(*(long *)(pQVar3 + 0x40) + 4) != 0)) {
        return *(QWidget **)(pQVar3 + 0x48);
      }
    }
  }
  return (QWidget *)0x0;
}

Assistant:

inline bool QWidget::testAttribute(Qt::WidgetAttribute attribute) const
{
    if (attribute < int(8*sizeof(uint)))
        return data->widget_attributes & (1<<attribute);
    return testAttribute_helper(attribute);
}